

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O1

PktOut * ssh2_bpp_new_pktout(int pkt_type)

{
  PktOut *pPVar1;
  
  pPVar1 = ssh_new_packet();
  pPVar1->length = 5;
  pPVar1->minlen = 0;
  pPVar1->type = pkt_type;
  BinarySink_put_byte(pPVar1->binarysink_,(uchar)pkt_type);
  pPVar1->prefix = pPVar1->length;
  return pPVar1;
}

Assistant:

static PktOut *ssh2_bpp_new_pktout(int pkt_type)
{
    PktOut *pkt = ssh_new_packet();
    pkt->length = 5; /* space for packet length + padding length */
    pkt->minlen = 0;
    pkt->type = pkt_type;
    put_byte(pkt, pkt_type);
    pkt->prefix = pkt->length;
    return pkt;
}